

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

int log_add_callback(log_LogFn fn,void *udata,int level)

{
  Callback *pCVar1;
  ulong uVar2;
  Callback *pCVar3;
  ulong uVar4;
  
  pCVar1 = L.callbacks;
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    pCVar3 = pCVar1;
    if (uVar4 == 0x20) goto LAB_00108412;
    pCVar1 = pCVar3 + 1;
    uVar2 = uVar4 + 1;
  } while (pCVar3->fn != (log_LogFn)0x0);
  pCVar3->fn = fn;
  pCVar3->udata = udata;
  pCVar3->level = level;
LAB_00108412:
  return (uVar4 < 0x20) - 1;
}

Assistant:

int log_add_callback(log_LogFn fn, void *udata, int level) {
    for (int i = 0; i < MAX_CALLBACKS; i++) {
        if (!L.callbacks[i].fn) {
            L.callbacks[i] = (Callback){fn, udata, level};
            return 0;
        }
    }
    return -1;
}